

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void lest::report(ostream *os,message *e,text *test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  size_type sVar4;
  ostream *poVar5;
  char *__s;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  int local_38;
  
  pcVar2 = (e->where).file._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (e->where).file._M_string_length);
  local_38 = (e->where).line;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  pcVar2 = (e->kind)._M_dataplus._M_p;
  local_d8 = (long *)&local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (e->kind)._M_string_length);
  lVar3 = local_d0;
  local_98 = &local_88;
  if (local_d8 == (long *)&local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98 = local_d8;
  }
  local_88 = CONCAT71(uStack_c7,local_c8);
  local_90 = local_d0;
  local_d0 = 0;
  local_c8 = 0;
  local_d8 = (long *)&local_c8;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_98,lVar3);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar2 = (e->note).info._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (e->note).info._M_string_length);
  if (local_78._M_string_length == 0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    std::operator+(&local_f8," ",&local_78);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,__s,&local_f9);
  sVar4 = local_b0;
  if (local_b8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_a8) {
    local_f8.field_2._8_8_ = uStack_a0;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)local_b8;
  }
  local_f8.field_2._M_allocated_capacity._1_7_ = uStack_a7;
  local_f8.field_2._M_local_buf[0] = local_a8;
  local_f8._M_string_length = local_b0;
  local_b0 = 0;
  local_a8 = '\0';
  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_a8;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_f8._M_dataplus._M_p,sVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_d8 != (long *)&local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}